

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EllipsoidRecord1.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::EllipsoidRecord1::EllipsoidRecord1
          (EllipsoidRecord1 *this,KUINT8 Index,WorldCoordinates *CentroidLocation,Vector *Sigma,
          EulerAngles *Orientation)

{
  EulerAngles *Orientation_local;
  Vector *Sigma_local;
  WorldCoordinates *CentroidLocation_local;
  KUINT8 Index_local;
  EllipsoidRecord1 *this_local;
  
  EnvironmentRecord::EnvironmentRecord(&this->super_EnvironmentRecord);
  (this->super_EnvironmentRecord).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EllipsoidRecord1_0033a980;
  WorldCoordinates::WorldCoordinates(&this->m_CentLocation,CentroidLocation);
  Vector::Vector(&this->m_Sigma,Sigma);
  EulerAngles::EulerAngles(&this->m_Ori,Orientation);
  (this->super_EnvironmentRecord).m_ui32EnvRecTyp = 0x100000;
  (this->super_EnvironmentRecord).m_ui16Length = 0x180;
  return;
}

Assistant:

EllipsoidRecord1::EllipsoidRecord1( KUINT8 Index, const WorldCoordinates & CentroidLocation,
                                    const Vector & Sigma, const EulerAngles & Orientation ) :
    m_CentLocation( CentroidLocation ),
    m_Sigma( Sigma ),
    m_Ori( Orientation )
{
    m_ui32EnvRecTyp = EllipsoidRecord1Type;
    m_ui16Length = ( ELIPSOID_RECORD_1_SIZE - ENVIRONMENT_RECORD_SIZE ) * 8;
}